

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O2

bool __thiscall
cmConditionEvaluator::HandleLevel1
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *param_2,MessageType *param_3)

{
  char cVar1;
  iterator iVar2;
  iterator iVar3;
  bool bVar4;
  cmState *this_00;
  cmCommand *pcVar5;
  cmTarget *pcVar6;
  char *pcVar7;
  cmConditionEvaluator *pcVar8;
  cmMakefile *pcVar9;
  _Self __tmp;
  _List_node_base *p_Var10;
  cmExpandedCommandArgument *pcVar11;
  string *name;
  int reducible;
  iterator local_80;
  cmConditionEvaluator *local_78;
  iterator arg;
  iterator local_68;
  allocator local_59;
  _List_node_base *local_58;
  PolicyID pid;
  
  local_78 = this;
  local_58 = (_List_node_base *)newArgs;
  do {
    reducible = 0;
    p_Var10 = (((_List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *
                )&((_List_node_base *)newArgs)->_M_next)->_M_impl)._M_node.super__List_node_base.
              _M_next;
    while (p_Var10 != (_List_node_base *)newArgs) {
      local_80._M_node = p_Var10->_M_next;
      local_68._M_node = local_80._M_node;
      if (local_80._M_node != (_List_node_base *)newArgs) {
        local_68._M_node = (local_80._M_node)->_M_next;
      }
      arg._M_node = p_Var10;
      std::__cxx11::string::string((string *)&pid,"EXISTS",&local_59);
      pcVar11 = (cmExpandedCommandArgument *)(p_Var10 + 1);
      bVar4 = IsKeyword(local_78,(string *)&pid,pcVar11);
      iVar2._M_node = local_80._M_node;
      if (bVar4) {
        std::__cxx11::string::~string((string *)&pid);
        if (iVar2._M_node != (_List_node_base *)newArgs) {
          pcVar8 = (cmConditionEvaluator *)iVar2._M_node[1]._M_next;
          bVar4 = cmsys::SystemTools::FileExists((char *)pcVar8);
          HandlePredicate(pcVar8,bVar4,&reducible,&arg,newArgs,&local_80,&local_68);
        }
      }
      else {
        std::__cxx11::string::~string((string *)&pid);
      }
      std::__cxx11::string::string((string *)&pid,"IS_DIRECTORY",&local_59);
      bVar4 = IsKeyword(local_78,(string *)&pid,pcVar11);
      iVar2._M_node = local_80._M_node;
      if (bVar4) {
        std::__cxx11::string::~string((string *)&pid);
        if (iVar2._M_node != (_List_node_base *)newArgs) {
          std::__cxx11::string::string((string *)&pid,(char *)iVar2._M_node[1]._M_next,&local_59);
          pcVar9 = (cmMakefile *)&pid;
          bVar4 = cmsys::SystemTools::FileIsDirectory((string *)&pid);
          HandlePredicate((cmConditionEvaluator *)pcVar9,bVar4,&reducible,&arg,newArgs,&local_80,
                          &local_68);
          goto LAB_003bcfc8;
        }
      }
      else {
LAB_003bcfc8:
        std::__cxx11::string::~string((string *)&pid);
      }
      std::__cxx11::string::string((string *)&pid,"IS_SYMLINK",&local_59);
      bVar4 = IsKeyword(local_78,(string *)&pid,pcVar11);
      iVar2._M_node = local_80._M_node;
      if (bVar4) {
        std::__cxx11::string::~string((string *)&pid);
        if (iVar2._M_node != (_List_node_base *)newArgs) {
          std::__cxx11::string::string((string *)&pid,(char *)iVar2._M_node[1]._M_next,&local_59);
          pcVar9 = (cmMakefile *)&pid;
          bVar4 = cmsys::SystemTools::FileIsSymlink((string *)&pid);
          HandlePredicate((cmConditionEvaluator *)pcVar9,bVar4,&reducible,&arg,newArgs,&local_80,
                          &local_68);
          goto LAB_003bd042;
        }
      }
      else {
LAB_003bd042:
        std::__cxx11::string::~string((string *)&pid);
      }
      std::__cxx11::string::string((string *)&pid,"IS_ABSOLUTE",&local_59);
      bVar4 = IsKeyword(local_78,(string *)&pid,pcVar11);
      iVar2._M_node = local_80._M_node;
      if (bVar4) {
        std::__cxx11::string::~string((string *)&pid);
        if (iVar2._M_node != (_List_node_base *)newArgs) {
          pcVar8 = (cmConditionEvaluator *)iVar2._M_node[1]._M_next;
          bVar4 = cmsys::SystemTools::FileIsFullPath((char *)pcVar8);
          HandlePredicate(pcVar8,bVar4,&reducible,&arg,newArgs,&local_80,&local_68);
        }
      }
      else {
        std::__cxx11::string::~string((string *)&pid);
      }
      std::__cxx11::string::string((string *)&pid,"COMMAND",&local_59);
      iVar3 = arg;
      pcVar11 = (cmExpandedCommandArgument *)(arg._M_node + 1);
      bVar4 = IsKeyword(local_78,(string *)&pid,pcVar11);
      iVar2._M_node = local_80._M_node;
      if (bVar4) {
        std::__cxx11::string::~string((string *)&pid);
        if (iVar2._M_node != (_List_node_base *)newArgs) {
          this_00 = cmMakefile::GetState(local_78->Makefile);
          std::__cxx11::string::string((string *)&pid,(char *)iVar2._M_node[1]._M_next,&local_59);
          pcVar5 = cmState::GetCommand(this_00,(string *)&pid);
          pcVar9 = (cmMakefile *)&pid;
          std::__cxx11::string::~string((string *)&pid);
          newArgs = (cmArgumentList *)local_58;
          HandlePredicate((cmConditionEvaluator *)pcVar9,pcVar5 != (cmCommand *)0x0,&reducible,&arg,
                          (cmArgumentList *)local_58,&local_80,&local_68);
        }
      }
      else {
        std::__cxx11::string::~string((string *)&pid);
      }
      std::__cxx11::string::string((string *)&pid,"POLICY",&local_59);
      bVar4 = IsKeyword(local_78,(string *)&pid,pcVar11);
      iVar2._M_node = local_80._M_node;
      if (bVar4) {
        std::__cxx11::string::~string((string *)&pid);
        if (iVar2._M_node != (_List_node_base *)newArgs) {
          pcVar8 = (cmConditionEvaluator *)iVar2._M_node[1]._M_next;
          bVar4 = cmPolicies::GetPolicyID((char *)pcVar8,&pid);
          HandlePredicate(pcVar8,bVar4,&reducible,&arg,newArgs,&local_80,&local_68);
        }
      }
      else {
        std::__cxx11::string::~string((string *)&pid);
      }
      std::__cxx11::string::string((string *)&pid,"TARGET",&local_59);
      bVar4 = IsKeyword(local_78,(string *)&pid,pcVar11);
      iVar2._M_node = local_80._M_node;
      if (bVar4) {
        std::__cxx11::string::~string((string *)&pid);
        if (iVar2._M_node != local_58) {
          pcVar9 = local_78->Makefile;
          pcVar6 = cmMakefile::FindTargetToUse(pcVar9,(string *)(iVar2._M_node + 1),false);
          HandlePredicate((cmConditionEvaluator *)pcVar9,pcVar6 != (cmTarget *)0x0,&reducible,&arg,
                          (cmArgumentList *)local_58,&local_80,&local_68);
        }
      }
      else {
        std::__cxx11::string::~string((string *)&pid);
      }
      std::__cxx11::string::string((string *)&pid,"DEFINED",&local_59);
      bVar4 = IsKeyword(local_78,(string *)&pid,pcVar11);
      iVar2._M_node = local_80._M_node;
      if (bVar4) {
        std::__cxx11::string::~string((string *)&pid);
        newArgs = (cmArgumentList *)local_58;
        if (iVar2._M_node != local_58) {
          p_Var10 = iVar2._M_node[1]._M_prev;
          name = (string *)(iVar2._M_node + 1);
          if (p_Var10 < (_List_node_base *)0x5) {
LAB_003bd32d:
            pcVar9 = local_78->Makefile;
            bVar4 = cmMakefile::IsDefinitionSet(pcVar9,name);
          }
          else {
            std::__cxx11::string::substr((ulong)&pid,(ulong)name);
            bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&pid,"ENV{");
            if (!bVar4) {
              std::__cxx11::string::~string((string *)&pid);
              goto LAB_003bd32d;
            }
            cVar1 = ((name->_M_dataplus)._M_p + -1)[(long)p_Var10];
            std::__cxx11::string::~string((string *)&pid);
            if (cVar1 != '}') goto LAB_003bd32d;
            std::__cxx11::string::substr((ulong)&pid,(ulong)name);
            pcVar7 = cmsys::SystemTools::GetEnv((char *)_pid);
            bVar4 = pcVar7 != (char *)0x0;
            pcVar9 = (cmMakefile *)&pid;
            std::__cxx11::string::~string((string *)&pid);
          }
          newArgs = (cmArgumentList *)local_58;
          HandlePredicate((cmConditionEvaluator *)pcVar9,bVar4,&reducible,&arg,
                          (cmArgumentList *)local_58,&local_80,&local_68);
        }
      }
      else {
        std::__cxx11::string::~string((string *)&pid);
        newArgs = (cmArgumentList *)local_58;
      }
      p_Var10 = (iVar3._M_node)->_M_next;
    }
    if (reducible == 0) {
      return true;
    }
  } while( true );
}

Assistant:

bool cmConditionEvaluator::HandleLevel1(cmArgumentList &newArgs,
                  std::string &, cmake::MessageType &)
{
  int reducible;
  do
    {
    reducible = 0;
    cmArgumentList::iterator arg = newArgs.begin();
    cmArgumentList::iterator argP1;
    cmArgumentList::iterator argP2;
    while (arg != newArgs.end())
      {
      argP1 = arg;
      this->IncrementArguments(newArgs,argP1,argP2);
      // does a file exist
      if (this->IsKeyword("EXISTS", *arg) && argP1  != newArgs.end())
        {
        this->HandlePredicate(
          cmSystemTools::FileExists(argP1->c_str()),
          reducible, arg, newArgs, argP1, argP2);
        }
      // does a directory with this name exist
      if (this->IsKeyword("IS_DIRECTORY", *arg) && argP1  != newArgs.end())
        {
        this->HandlePredicate(
          cmSystemTools::FileIsDirectory(argP1->c_str()),
          reducible, arg, newArgs, argP1, argP2);
        }
      // does a symlink with this name exist
      if (this->IsKeyword("IS_SYMLINK", *arg) && argP1  != newArgs.end())
        {
        this->HandlePredicate(
          cmSystemTools::FileIsSymlink(argP1->c_str()),
          reducible, arg, newArgs, argP1, argP2);
        }
      // is the given path an absolute path ?
      if (this->IsKeyword("IS_ABSOLUTE", *arg) && argP1  != newArgs.end())
        {
        this->HandlePredicate(
          cmSystemTools::FileIsFullPath(argP1->c_str()),
          reducible, arg, newArgs, argP1, argP2);
        }
      // does a command exist
      if (this->IsKeyword("COMMAND", *arg) && argP1  != newArgs.end())
        {
        cmCommand* command =
            this->Makefile.GetState()->GetCommand(argP1->c_str());
        this->HandlePredicate(
          command ? true : false,
          reducible, arg, newArgs, argP1, argP2);
        }
      // does a policy exist
      if (this->IsKeyword("POLICY", *arg) && argP1 != newArgs.end())
        {
        cmPolicies::PolicyID pid;
        this->HandlePredicate(
          cmPolicies::GetPolicyID(argP1->c_str(), pid),
            reducible, arg, newArgs, argP1, argP2);
        }
      // does a target exist
      if (this->IsKeyword("TARGET", *arg) && argP1 != newArgs.end())
        {
        this->HandlePredicate(
          this->Makefile.FindTargetToUse(argP1->GetValue())?true:false,
          reducible, arg, newArgs, argP1, argP2);
        }
      // is a variable defined
      if (this->IsKeyword("DEFINED", *arg) && argP1  != newArgs.end())
        {
        size_t argP1len = argP1->GetValue().size();
        bool bdef = false;
        if(argP1len > 4 && argP1->GetValue().substr(0, 4) == "ENV{" &&
           argP1->GetValue().operator[](argP1len-1) == '}')
          {
          std::string env = argP1->GetValue().substr(4, argP1len-5);
          bdef = cmSystemTools::GetEnv(env.c_str())?true:false;
          }
        else
          {
          bdef = this->Makefile.IsDefinitionSet(argP1->GetValue());
          }
        this->HandlePredicate(bdef, reducible, arg, newArgs, argP1, argP2);
        }
      ++arg;
      }
    }
  while (reducible);
  return true;
}